

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O3

void __thiscall cs::statement_namespace::dump(statement_namespace *this,ostream *o)

{
  _Elt_pointer ppsVar1;
  ostream *poVar2;
  statement_base **ptr;
  _Elt_pointer ppsVar3;
  _Elt_pointer ppsVar4;
  _Map_pointer pppsVar5;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,"< BeginNamespace: ID = \"",0x18);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (o,(this->mName)._M_dataplus._M_p,(this->mName)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" >\n",4);
  ppsVar3 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppsVar1 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppsVar3 != ppsVar1) {
    ppsVar4 = (this->mBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_start._M_last;
    pppsVar5 = (this->mBlock).
               super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      (*(*ppsVar3)->_vptr_statement_base[5])(*ppsVar3,o);
      ppsVar3 = ppsVar3 + 1;
      if (ppsVar3 == ppsVar4) {
        ppsVar3 = pppsVar5[1];
        pppsVar5 = pppsVar5 + 1;
        ppsVar4 = ppsVar3 + 0x40;
      }
    } while (ppsVar3 != ppsVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,"< EndNamespace >\n",0x11);
  return;
}

Assistant:

void statement_namespace::dump(std::ostream &o) const
	{
		o << "< BeginNamespace: ID = \"" << mName << "\" >\n";
		for (auto &ptr: mBlock)
			ptr->dump(o);
		o << "< EndNamespace >\n";
	}